

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

void __thiscall QString::reallocGrowData(QString *this,qsizetype n)

{
  Data *pDVar1;
  long lVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = n + (ulong)(n == 0);
  pDVar1 = (this->d).d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<char16_t>::allocateGrow(&local_38,&this->d,lVar2,GrowsAtEnd);
    if (local_38.ptr == (char16_t *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        qBadAlloc();
      }
    }
    else {
      lVar2 = (this->d).size;
      if (lVar2 != 0) {
        memcpy(local_38.ptr + local_38.size,(this->d).ptr,lVar2 * 2);
        local_38.size = local_38.size + lVar2;
      }
      local_38.ptr[local_38.size] = L'\0';
      QArrayDataPointer<char16_t>::operator=(&this->d,&local_38);
      if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        return;
      }
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    QtPrivate::QPodArrayOps<char16_t>::reallocate
              ((QPodArrayOps<char16_t> *)this,lVar2 + (pDVar1->super_QArrayData).alloc,Grow);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QString::reallocGrowData(qsizetype n)
{
    if (!n)  // expected to always allocate
        n = 1;

    if (d->needsDetach()) {
        DataPointer dd(DataPointer::allocateGrow(d, n, QArrayData::GrowsAtEnd));
        Q_CHECK_PTR(dd.data());
        dd->copyAppend(d.data(), d.data() + d.size);
        dd.data()[dd.size] = 0;
        d = dd;
    } else {
        d->reallocate(d.constAllocatedCapacity() + n, QArrayData::Grow);
    }
}